

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v8::detail::write<char,fmt::v8::appender>
                   (appender out,char *s,basic_format_specs<char> *specs,locale_ref param_4)

{
  bool bVar1;
  char *pcVar2;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar3;
  locale_ref in_R9;
  basic_string_view<char> s_00;
  error_handler local_19;
  
  bVar1 = check_cstring_type_spec<fmt::v8::detail::error_handler>(specs->type,&local_19);
  if (bVar1) {
    pcVar2 = (char *)strlen(s);
    s_00.size_ = (size_t)specs;
    s_00.data_ = pcVar2;
    bVar3.container =
         (buffer<char> *)
         write<char,fmt::v8::appender>
                   (out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,
                    (appender)s,s_00,(basic_format_specs<char> *)0x0,in_R9);
  }
  else {
    bVar3.container =
         (buffer<char> *)write_ptr<char,fmt::v8::appender,unsigned_long>(out,(unsigned_long)s,specs)
    ;
  }
  return (appender)bVar3.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, const Char* s,
                         const basic_format_specs<Char>& specs, locale_ref)
    -> OutputIt {
  return check_cstring_type_spec(specs.type)
             ? write(out, basic_string_view<Char>(s), specs, {})
             : write_ptr<Char>(out, to_uintptr(s), &specs);
}